

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLogger.cpp
# Opt level: O0

MemoryLogger * __thiscall SLogLib::MemoryLogger::Messages_abi_cxx11_(MemoryLogger *this)

{
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  reference pbVar2;
  long in_RSI;
  string *_message;
  iterator __end1;
  iterator __begin1;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  stringstream local_1a8 [8];
  stringstream _stream;
  ostream local_198 [376];
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> _lock;
  MemoryLogger *this_local;
  
  std::lock_guard<std::mutex>::lock_guard(&local_20,(mutex_type *)(*(long *)(in_RSI + 0x10) + 0x18))
  ;
  std::__cxx11::stringstream::stringstream(local_1a8);
  this_00 = *(list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              **)(in_RSI + 0x10);
  __end1 = std::__cxx11::
           list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
  _message = (string *)
             std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(this_00);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&_message);
    if (!bVar1) break;
    pbVar2 = std::
             _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    std::operator<<(local_198,(string *)pbVar2);
    std::
    _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return this;
}

Assistant:

std::string MemoryLogger::Messages() const
{
	std::lock_guard<std::mutex> _lock(mPriv->mMessagesMutex);
	
	std::stringstream _stream;
	for(const std::string& _message : mPriv->mMessages)
	{
		_stream << _message;
	}
	return _stream.str();
}